

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O1

void __thiscall adios2::transport::FileFStream::Seek(FileFStream *this,size_t start)

{
  bool bVar1;
  char cVar2;
  long *plVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  char cVar7;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  if (start == 0xffffffffffffffff) {
    SeekToEnd(this);
    return;
  }
  WaitForOpen(this);
  std::ostream::seekp((long)&this->field_0x100,(_Ios_Seekdir)start);
  cVar7 = '\x01';
  if (9 < start) {
    sVar4 = start;
    cVar2 = '\x04';
    do {
      cVar7 = cVar2;
      if (sVar4 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00649003;
      }
      if (sVar4 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00649003;
      }
      if (sVar4 < 10000) goto LAB_00649003;
      bVar1 = 99999 < sVar4;
      sVar4 = sVar4 / 10000;
      cVar2 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_00649003:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,start);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x75de40);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,
                              (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  CheckFile(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void FileFStream::Seek(const size_t start)
{
    if (start != MaxSizeT)
    {
        WaitForOpen();
        m_FileStream.seekp(start, std::ios_base::beg);
        CheckFile("couldn't move to offset " + std::to_string(start) + " of file " + m_Name +
                  ", in call to fstream seekp");
    }
    else
    {
        SeekToEnd();
    }
}